

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O1

int get_num_images(char *imgdirpath)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  int iVar3;
  
  __dirp = opendir(imgdirpath);
  if (__dirp == (DIR *)0x0) {
    iVar3 = 0;
    fprintf(_stderr,"Could not open Folder %s\n",imgdirpath);
  }
  else {
    pdVar2 = readdir(__dirp);
    if (pdVar2 == (dirent *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        iVar1 = strcmp(".",pdVar2->d_name);
        if ((iVar1 != 0) && (iVar1 = strcmp("..",pdVar2->d_name), iVar1 != 0)) {
          iVar3 = iVar3 + 1;
        }
        pdVar2 = readdir(__dirp);
      } while (pdVar2 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  return iVar3;
}

Assistant:

int get_num_images(char *imgdirpath)
{
    DIR *dir;
    struct dirent* content;
    int num_images = 0;

    /*Reading the input images from given input directory*/

    dir = opendir(imgdirpath);
    if (!dir) {
        fprintf(stderr, "Could not open Folder %s\n", imgdirpath);
        return 0;
    }

    while ((content = readdir(dir)) != NULL) {
        if (strcmp(".", content->d_name) == 0 || strcmp("..", content->d_name) == 0) {
            continue;
        }
        num_images++;
    }
    closedir(dir);
    return num_images;
}